

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NaConLaw.cpp
# Opt level: O0

void __thiscall NaControlLaw::Load(NaControlLaw *this,NaDataStream *ds)

{
  NaControlLawSource NVar1;
  NaControlLawItem *pNVar2;
  size_t sVar3;
  void *pvVar4;
  NaDataStream *in_RSI;
  long in_RDI;
  int i;
  int nItems;
  char szBuf [1024];
  NaDataStream *in_stack_fffffffffffffbb8;
  NaLinearNoiseGen *in_stack_fffffffffffffbc0;
  NaControlLawItem *in_stack_fffffffffffffbd8;
  undefined4 in_stack_fffffffffffffbe0;
  int iVar5;
  int in_stack_fffffffffffffbe4;
  char local_418 [144];
  
  NaDataStream::GetF(in_RSI,"%s",local_418);
  NVar1 = StrToSourceIO((char *)in_stack_fffffffffffffbd8);
  *(NaControlLawSource *)(in_RDI + 0x48) = NVar1;
  NaDataStream::GetF(in_RSI,"%u",&stack0xfffffffffffffbe4);
  NaDynAr<NaControlLawItem>::clean
            ((NaDynAr<NaControlLawItem> *)
             CONCAT44(in_stack_fffffffffffffbe4,in_stack_fffffffffffffbe0));
  for (iVar5 = 0; iVar5 < in_stack_fffffffffffffbe4; iVar5 = iVar5 + 1) {
    in_stack_fffffffffffffbb8 = (NaDataStream *)(in_RDI + 0x50);
    in_stack_fffffffffffffbc0 = (NaLinearNoiseGen *)operator_new(0x40);
    NaControlLawItem::NaControlLawItem((NaControlLawItem *)in_stack_fffffffffffffbc0);
    NaDynAr<NaControlLawItem>::addh
              ((NaDynAr<NaControlLawItem> *)CONCAT44(in_stack_fffffffffffffbe4,iVar5),
               in_stack_fffffffffffffbd8);
    pNVar2 = NaDynAr<NaControlLawItem>::operator[]
                       ((NaDynAr<NaControlLawItem> *)in_stack_fffffffffffffbc0,
                        (int)((ulong)in_stack_fffffffffffffbb8 >> 0x20));
    (*(pNVar2->super_NaConfigPart)._vptr_NaConfigPart[3])(pNVar2,in_RSI);
  }
  NaDataStream::GetF(in_RSI,"%s",local_418);
  sVar3 = strlen(local_418);
  pvVar4 = operator_new__(sVar3 + 1);
  *(void **)(in_RDI + 0x70) = pvVar4;
  strcpy(*(char **)(in_RDI + 0x70),local_418);
  *(undefined8 *)(in_RDI + 0x78) = 0;
  NaDataStream::GetF(in_RSI,"%lg",in_RDI + 0x88);
  NaLinearNoiseGen::Load(in_stack_fffffffffffffbc0,in_stack_fffffffffffffbb8);
  return;
}

Assistant:

void    NaControlLaw::Load (NaDataStream& ds)
{
    char    szBuf[1024];

    ds.GetF("%s", szBuf);
    source = StrToSourceIO(szBuf);

    // clsDescription
    int    nItems, i;
    ds.GetF("%u", &nItems);
    items.clean();
    for(i = 0; i < nItems; ++i){
        items.addh(new NaControlLawItem());
        items[i].Load(ds);
    }

    // clsFromFile
    ds.GetF("%s", szBuf);
    filepath = new char[strlen(szBuf) + 1];
    strcpy(filepath, szBuf);
    dataio = NULL;

    // clsManual
    ds.GetF("%lg", &start_value);

    // clsRandom
    lin_rand.Load(ds);
}